

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O3

void Pdr_ManStop(Pdr_Man_t *p)

{
  int *piVar1;
  void *__ptr;
  void **__ptr_00;
  Vec_Wec_t *__ptr_01;
  undefined8 in_RAX;
  undefined4 uVar3;
  ulong uVar2;
  void *pvVar4;
  Aig_Man_t *pAVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  Vec_Ptr_t *pVVar8;
  long lVar9;
  Vec_Vec_t *__ptr_02;
  long lVar10;
  double dVar11;
  double dVar12;
  
  uVar3 = (undefined4)((ulong)in_RAX >> 0x20);
  pAVar5 = p->pAig;
  Aig_ManCleanMarkAB(pAVar5);
  iVar6 = (int)pAVar5;
  if (p->pPars->fVerbose != 0) {
    Abc_Print(iVar6,"Block =%5d  Oblig =%6d  Clause =%6d  Call =%6d (sat=%.1f%%)  Start =%4d\n",
              ((double)p->nCallsS * 100.0) / (double)p->nCalls,(ulong)(uint)p->nBlocks,
              (ulong)(uint)p->nObligs,(ulong)(uint)p->nCubes,(ulong)(uint)p->nCalls,
              CONCAT44(uVar3,p->nStarts));
    Abc_Print(iVar6,"%s =","SAT solving");
    dVar11 = 0.0;
    if (p->tTotal != 0) {
      dVar11 = ((double)p->tSat * 100.0) / (double)p->tTotal;
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",(double)p->tSat / 1000000.0,dVar11);
    Abc_Print(iVar6,"%s =","  unsat    ");
    dVar11 = 0.0;
    if (p->tTotal != 0) {
      dVar11 = ((double)p->tSatUnsat * 100.0) / (double)p->tTotal;
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",(double)p->tSatUnsat / 1000000.0,dVar11);
    Abc_Print(iVar6,"%s =","  sat      ");
    dVar11 = 0.0;
    if (p->tTotal != 0) {
      dVar11 = ((double)p->tSatSat * 100.0) / (double)p->tTotal;
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",(double)p->tSatSat / 1000000.0,dVar11);
    Abc_Print(iVar6,"%s =","Generalize ");
    dVar11 = 0.0;
    if (p->tTotal != 0) {
      dVar11 = ((double)p->tGeneral * 100.0) / (double)p->tTotal;
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",(double)p->tGeneral / 1000000.0,dVar11);
    Abc_Print(iVar6,"%s =","Push clause");
    dVar11 = 0.0;
    if (p->tTotal != 0) {
      dVar11 = ((double)p->tPush * 100.0) / (double)p->tTotal;
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",(double)p->tPush / 1000000.0,dVar11);
    Abc_Print(iVar6,"%s =","Ternary sim");
    dVar11 = 0.0;
    if (p->tTotal != 0) {
      dVar11 = ((double)p->tTsim * 100.0) / (double)p->tTotal;
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",(double)p->tTsim / 1000000.0,dVar11);
    Abc_Print(iVar6,"%s =","Containment");
    dVar11 = 0.0;
    if (p->tTotal != 0) {
      dVar11 = ((double)p->tContain * 100.0) / (double)p->tTotal;
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",(double)p->tContain / 1000000.0,dVar11);
    Abc_Print(iVar6,"%s =","CNF compute");
    dVar11 = 0.0;
    if (p->tTotal != 0) {
      dVar11 = ((double)p->tCnf * 100.0) / (double)p->tTotal;
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",(double)p->tCnf / 1000000.0,dVar11);
    Abc_Print(iVar6,"%s =","TOTAL      ");
    dVar11 = (double)p->tTotal;
    dVar12 = 0.0;
    if (p->tTotal != 0) {
      dVar12 = (dVar11 * 100.0) / dVar11;
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",dVar11 / 1000000.0,dVar12);
    fflush(_stdout);
  }
  pVVar8 = p->vSolvers;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      sat_solver_delete((sat_solver *)pVVar8->pArray[lVar10]);
      lVar10 = lVar10 + 1;
      pVVar8 = p->vSolvers;
    } while (lVar10 < pVVar8->nSize);
  }
  if (pVVar8->pArray != (void **)0x0) {
    free(pVVar8->pArray);
  }
  free(pVVar8);
  __ptr_02 = p->vClauses;
  uVar2 = (ulong)(uint)__ptr_02->nSize;
  if (0 < __ptr_02->nSize) {
    lVar10 = 0;
    do {
      if ((int)uVar2 <= lVar10) {
LAB_00577e36:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar4 = __ptr_02->pArray[lVar10];
      if (0 < *(int *)((long)pvVar4 + 4)) {
        lVar9 = 0;
        do {
          Pdr_SetDeref(*(Pdr_Set_t **)(*(long *)((long)pvVar4 + 8) + lVar9 * 8));
          __ptr_02 = p->vClauses;
          uVar2 = (ulong)__ptr_02->nSize;
          if ((long)uVar2 <= lVar10) goto LAB_00577e36;
          lVar9 = lVar9 + 1;
          pvVar4 = __ptr_02->pArray[lVar10];
        } while (lVar9 < *(int *)((long)pvVar4 + 4));
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)uVar2);
    if (0 < (int)uVar2) {
      lVar10 = 0;
      do {
        pvVar4 = __ptr_02->pArray[lVar10];
        if (pvVar4 != (void *)0x0) {
          if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar4 + 8));
          }
          free(pvVar4);
          uVar2 = (ulong)(uint)__ptr_02->nSize;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < (int)uVar2);
    }
  }
  if (__ptr_02->pArray != (void **)0x0) {
    free(__ptr_02->pArray);
  }
  free(__ptr_02);
  Pdr_QueueStop(p);
  if (p->pOrder != (int *)0x0) {
    free(p->pOrder);
    p->pOrder = (int *)0x0;
  }
  pVVar7 = p->vActVars;
  piVar1 = pVVar7->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar7);
  Cnf_DataFree(p->pCnf1);
  pVVar7 = p->vVar2Reg;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      p->vVar2Reg->pArray = (int *)0x0;
      pVVar7 = p->vVar2Reg;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_00577a74;
    }
    free(pVVar7);
    p->vVar2Reg = (Vec_Int_t *)0x0;
  }
LAB_00577a74:
  Cnf_DataFree(p->pCnf2);
  pVVar7 = p->pvId2Vars;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    pAVar5 = p->pAig;
    if (0 < pAVar5->vObjs->nSize) {
      lVar10 = 8;
      lVar9 = 0;
      do {
        pvVar4 = *(void **)((long)&pVVar7->nCap + lVar10);
        if (pvVar4 != (void *)0x0) {
          free(pvVar4);
          pVVar7 = p->pvId2Vars;
          *(undefined8 *)((long)&pVVar7->nCap + lVar10) = 0;
          pAVar5 = p->pAig;
        }
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0x10;
      } while (lVar9 < pAVar5->vObjs->nSize);
    }
    free(pVVar7);
    p->pvId2Vars = (Vec_Int_t *)0x0;
  }
  if (0 < (p->vVar2Ids).nSize) {
    lVar10 = 0;
    do {
      pvVar4 = (p->vVar2Ids).pArray[lVar10];
      __ptr = *(void **)((long)pvVar4 + 8);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      free(pvVar4);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->vVar2Ids).nSize);
  }
  __ptr_00 = (p->vVar2Ids).pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
    (p->vVar2Ids).pArray = (void **)0x0;
  }
  __ptr_01 = p->vVLits;
  if (__ptr_01 != (Vec_Wec_t *)0x0) {
    iVar6 = __ptr_01->nCap;
    pVVar7 = __ptr_01->pArray;
    if (iVar6 < 1) {
      if (pVVar7 != (Vec_Int_t *)0x0) goto LAB_00577b7b;
    }
    else {
      lVar9 = 8;
      lVar10 = 0;
      do {
        pvVar4 = *(void **)((long)&pVVar7->nCap + lVar9);
        if (pvVar4 != (void *)0x0) {
          free(pvVar4);
          pVVar7 = __ptr_01->pArray;
          *(undefined8 *)((long)&pVVar7->nCap + lVar9) = 0;
          iVar6 = __ptr_01->nCap;
        }
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + 0x10;
      } while (lVar10 < iVar6);
LAB_00577b7b:
      free(pVVar7);
    }
    free(__ptr_01);
    p->vVLits = (Vec_Wec_t *)0x0;
  }
  Cnf_ManStop(p->pCnfMan);
  pVVar7 = p->vPrio;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      p->vPrio->pArray = (int *)0x0;
      pVVar7 = p->vPrio;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_00577be1;
    }
    free(pVVar7);
    p->vPrio = (Vec_Int_t *)0x0;
  }
LAB_00577be1:
  pVVar7 = p->vLits;
  piVar1 = pVVar7->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar7);
  pVVar7 = p->vCiObjs;
  piVar1 = pVVar7->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar7);
  pVVar7 = p->vCoObjs;
  piVar1 = pVVar7->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar7);
  pVVar7 = p->vCiVals;
  piVar1 = pVVar7->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar7);
  pVVar7 = p->vCoVals;
  piVar1 = pVVar7->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar7);
  pVVar7 = p->vNodes;
  piVar1 = pVVar7->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar7);
  pVVar7 = p->vUndo;
  piVar1 = pVVar7->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar7);
  pVVar7 = p->vVisits;
  piVar1 = pVVar7->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar7);
  pVVar7 = p->vCi2Rem;
  piVar1 = pVVar7->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar7);
  pVVar7 = p->vRes;
  piVar1 = pVVar7->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar7);
  pVVar7 = p->vSuppLits;
  piVar1 = pVVar7->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar7);
  pVVar8 = p->vInfCubes;
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
      p->vInfCubes->pArray = (void **)0x0;
      pVVar8 = p->vInfCubes;
      if (pVVar8 == (Vec_Ptr_t *)0x0) goto LAB_00577d68;
    }
    free(pVVar8);
    p->vInfCubes = (Vec_Ptr_t *)0x0;
  }
LAB_00577d68:
  if (p->pCubeJust != (Pdr_Set_t *)0x0) {
    free(p->pCubeJust);
    p->pCubeJust = (Pdr_Set_t *)0x0;
  }
  if (p->pTime4Outs != (abctime *)0x0) {
    free(p->pTime4Outs);
    p->pTime4Outs = (abctime *)0x0;
  }
  pVVar8 = p->vCexes;
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    iVar6 = pVVar8->nSize;
    if (0 < iVar6) {
      lVar10 = 0;
      do {
        if ((void *)0x2 < pVVar8->pArray[lVar10]) {
          free(pVVar8->pArray[lVar10]);
          iVar6 = pVVar8->nSize;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < iVar6);
    }
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
    }
    free(pVVar8);
  }
  pAVar5 = p->pAig;
  if (pAVar5->pFanData != (int *)0x0) {
    Aig_ManFanoutStop(pAVar5);
    pAVar5 = p->pAig;
  }
  if (pAVar5->pTerSimData != (uint *)0x0) {
    free(pAVar5->pTerSimData);
    p->pAig->pTerSimData = (uint *)0x0;
  }
  free(p);
  return;
}

Assistant:

void Pdr_ManStop( Pdr_Man_t * p )
{
    Pdr_Set_t * pCla;
    sat_solver * pSat;
    int i, k;
    Aig_ManCleanMarkAB( p->pAig );
    if ( p->pPars->fVerbose ) 
    {
        Abc_Print( 1, "Block =%5d  Oblig =%6d  Clause =%6d  Call =%6d (sat=%.1f%%)  Start =%4d\n", 
            p->nBlocks, p->nObligs, p->nCubes, p->nCalls, 100.0 * p->nCallsS / p->nCalls, p->nStarts );
        ABC_PRTP( "SAT solving", p->tSat,       p->tTotal );
        ABC_PRTP( "  unsat    ", p->tSatUnsat,  p->tTotal );
        ABC_PRTP( "  sat      ", p->tSatSat,    p->tTotal );
        ABC_PRTP( "Generalize ", p->tGeneral,   p->tTotal );
        ABC_PRTP( "Push clause", p->tPush,      p->tTotal );
        ABC_PRTP( "Ternary sim", p->tTsim,      p->tTotal );
        ABC_PRTP( "Containment", p->tContain,   p->tTotal );
        ABC_PRTP( "CNF compute", p->tCnf,       p->tTotal );
        ABC_PRTP( "TOTAL      ", p->tTotal,     p->tTotal );
        fflush( stdout );
    }
//    Abc_Print( 1, "SS =%6d. SU =%6d. US =%6d. UU =%6d.\n", p->nCasesSS, p->nCasesSU, p->nCasesUS, p->nCasesUU );
    Vec_PtrForEachEntry( sat_solver *, p->vSolvers, pSat, i )
        sat_solver_delete( pSat );
    Vec_PtrFree( p->vSolvers );
    Vec_VecForEachEntry( Pdr_Set_t *, p->vClauses, pCla, i, k )
        Pdr_SetDeref( pCla );
    Vec_VecFree( p->vClauses );
    Pdr_QueueStop( p );
    ABC_FREE( p->pOrder );
    Vec_IntFree( p->vActVars );
    // static CNF
    Cnf_DataFree( p->pCnf1 );
    Vec_IntFreeP( &p->vVar2Reg );
    // dynamic CNF
    Cnf_DataFree( p->pCnf2 );
    if ( p->pvId2Vars )
    for ( i = 0; i < Aig_ManObjNumMax(p->pAig); i++ )
        ABC_FREE( p->pvId2Vars[i].pArray );
    ABC_FREE( p->pvId2Vars );
//    Vec_VecFreeP( (Vec_Vec_t **)&p->vVar2Ids );
    for ( i = 0; i < Vec_PtrSize(&p->vVar2Ids); i++ )
        Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(&p->vVar2Ids, i) );
    ABC_FREE( p->vVar2Ids.pArray );
    Vec_WecFreeP( &p->vVLits );
    // CNF manager
    Cnf_ManStop( p->pCnfMan );
    // internal use
    Vec_IntFreeP( &p->vPrio   );  // priority flops
    Vec_IntFree( p->vLits     );  // array of literals
    Vec_IntFree( p->vCiObjs   );  // cone leaves
    Vec_IntFree( p->vCoObjs   );  // cone roots
    Vec_IntFree( p->vCiVals   );  // cone leaf values
    Vec_IntFree( p->vCoVals   );  // cone root values
    Vec_IntFree( p->vNodes    );  // cone nodes
    Vec_IntFree( p->vUndo     );  // cone undos
    Vec_IntFree( p->vVisits   );  // intermediate
    Vec_IntFree( p->vCi2Rem   );  // CIs to be removed
    Vec_IntFree( p->vRes      );  // final result
    Vec_IntFree( p->vSuppLits );  // support literals
    Vec_PtrFreeP( &p->vInfCubes );
    ABC_FREE( p->pCubeJust );
    ABC_FREE( p->pTime4Outs );
    if ( p->vCexes )
        Vec_PtrFreeFree( p->vCexes );
    // additional AIG data-members
    if ( p->pAig->pFanData != NULL )
        Aig_ManFanoutStop( p->pAig );
    if ( p->pAig->pTerSimData != NULL )
        ABC_FREE( p->pAig->pTerSimData );
    ABC_FREE( p );
}